

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O1

void __thiscall
mnf::Manifold::applyDiffRetractation(Manifold *this,RefMat *out,ConstRefMat *in,ConstRefVec *x)

{
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long local_18;
  long local_10;
  
  if ((this->super_ValidManifold).flag_ != 0x677d7257) {
    puts(
        "It appears that you\'re trying to call a method from a manifold that does not exist              anymore. Possible cause: the manifold was statically created in a scope (e.g. a function) which was              left since then. For Stan: https://www.youtube.com/watch?v=Yy8MUnlT9Oo"
        );
    __assert_fail("isValid() || seeMessageAbove()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0xd7,
                  "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
                 );
  }
  if ((in->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != this->representationDim_) {
    __assert_fail("in.cols() == representationDim_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0xd8,
                  "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
                 );
  }
  if ((out->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != this->tangentDim_) {
    __assert_fail("out.cols() == tangentDim_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0xd9,
                  "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
                 );
  }
  if ((in->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value ==
      (out->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value) {
    if ((x->
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ).
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
        .m_rows.m_value == this->representationDim_) {
      local_18 = (out->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_cols.m_value;
      local_28 = *(undefined4 *)
                  &(out->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_data;
      uStack_24 = *(undefined4 *)
                   ((long)&(out->
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           ).
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                           .
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_data + 4);
      uStack_20 = (undefined4)
                  (out->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_rows.m_value;
      uStack_1c = *(undefined4 *)
                   ((long)&(out->
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           ).
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                           .
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_rows.m_value + 4);
      local_10 = (out->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
      (*this->_vptr_Manifold[0x17])(this,&local_28);
      return;
    }
    __assert_fail("x.size() == representationDim_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                  ,0xdb,
                  "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
                 );
  }
  __assert_fail("in.rows() == out.rows()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/Manifold.cpp"
                ,0xda,
                "void mnf::Manifold::applyDiffRetractation(RefMat, const ConstRefMat &, const ConstRefVec &) const"
               );
}

Assistant:

void Manifold::applyDiffRetractation(RefMat out, const ConstRefMat& in,
                                     const ConstRefVec& x) const
{
  mnf_assert(isValid() || seeMessageAbove());
  mnf_assert(in.cols() == representationDim_);
  mnf_assert(out.cols() == tangentDim_);
  mnf_assert(in.rows() == out.rows());
  mnf_assert(x.size() == representationDim_);
  applyDiffRetractation_(out, in, x);
}